

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QString * __thiscall
QLocaleData::signPrefix(QString *__return_storage_ptr__,QLocaleData *this,bool negative,uint flags)

{
  undefined3 in_register_00000011;
  long in_FS_OFFSET;
  QStringView local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (CONCAT31(in_register_00000011,negative) == 0) {
    if ((flags & 0x10) == 0) {
      if ((flags & 8) == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
LAB_0011ceb7:
          __stack_chk_fail();
        }
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
      }
      else {
        local_20.m_data = L" ";
        local_20.m_size = 1;
        QStringView::toString(__return_storage_ptr__,&local_20);
        if (*(long *)(in_FS_OFFSET + 0x28) != local_10) goto LAB_0011ceb7;
      }
    }
    else {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_10) goto LAB_0011ceb7;
      positiveSign(__return_storage_ptr__,this);
    }
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_10) goto LAB_0011ceb7;
    negativeSign(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QLocaleData::signPrefix(bool negative, unsigned flags) const
{
    if (negative)
        return negativeSign();
    if (flags & AlwaysShowSign)
        return positiveSign();
    if (flags & BlankBeforePositive)
        return QStringView(u" ").toString();
    return {};
}